

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

_Bool is_some_rtr_mgr_group_established(rtr_mgr_config *config)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  group_node = (rtr_mgr_group_node *)tommy_list_head(&config->groups->list);
  do {
    if (group_node == (rtr_mgr_group_node *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._7_1_ = false;
LAB_00108068:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return config_local._7_1_;
      }
      __stack_chk_fail();
    }
    if (*(int *)(*(long *)((long)(group_node->node).data + 0x20) + 0x10) == 2) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._7_1_ = true;
      goto LAB_00108068;
    }
    group_node = (rtr_mgr_group_node *)(group_node->node).next;
  } while( true );
}

Assistant:

static bool is_some_rtr_mgr_group_established(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;

		if (group_node->group->status == RTR_MGR_ESTABLISHED) {
			pthread_rwlock_unlock(&config->mutex);
			return true;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return false;
}